

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O0

Status __thiscall
osqp::OsqpSolver::UpdateObjectiveMatrix
          (OsqpSolver *this,SparseMatrix<double,_0,_long_long> *objective_matrix)

{
  bool bVar1;
  pointer pOVar2;
  SparseMatrix<double,_0,_long_long> *in_RDX;
  TriangularView<const_Eigen::SparseMatrix<double,_0,_long_long>,_2U> TVar3;
  SparseMatrixBase<Eigen::TriangularView<const_Eigen::SparseMatrix<double,_0,_long_long>,_2U>_>
  local_78 [8];
  MatrixTypeNested local_70;
  undefined1 local_68 [8];
  SparseMatrix<double,_0,_long_long> objective_matrix_upper_triangle;
  SparseMatrix<double,_0,_long_long> *objective_matrix_local;
  OsqpSolver *this_local;
  
  objective_matrix_upper_triangle.m_data.m_allocatedSize = (Index)in_RDX;
  bVar1 = anon_unknown_6::IsUpperTriangular(in_RDX);
  if (bVar1) {
    pOVar2 = std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::get
                       ((unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *)
                        objective_matrix);
    anon_unknown_6::UpdateUpperTriangularObjectiveMatrix
              ((anon_unknown_6 *)this,
               (SparseMatrix<double,_0,_long_long> *)
               objective_matrix_upper_triangle.m_data.m_allocatedSize,pOVar2);
  }
  else {
    TVar3 = Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>::triangularView<2>
                      ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_> *)
                       objective_matrix_upper_triangle.m_data.m_allocatedSize);
    local_70 = TVar3.m_matrix;
    local_78[0].m_isRValue =
         (bool)TVar3.
               super_TriangularViewImpl<const_Eigen::SparseMatrix<double,_0,_long_long>,_2U,_Eigen::Sparse>
               .
               super_SparseMatrixBase<Eigen::TriangularView<const_Eigen::SparseMatrix<double,_0,_long_long>,_2U>_>
               .m_isRValue;
    Eigen::SparseMatrix<double,0,long_long>::
    SparseMatrix<Eigen::TriangularView<Eigen::SparseMatrix<double,0,long_long>const,2u>>
              ((SparseMatrix<double,0,long_long> *)local_68,local_78);
    pOVar2 = std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::get
                       ((unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *)
                        objective_matrix);
    anon_unknown_6::UpdateUpperTriangularObjectiveMatrix
              ((anon_unknown_6 *)this,(SparseMatrix<double,_0,_long_long> *)local_68,pOVar2);
    Eigen::SparseMatrix<double,_0,_long_long>::~SparseMatrix
              ((SparseMatrix<double,_0,_long_long> *)local_68);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status OsqpSolver::UpdateObjectiveMatrix(
    const Eigen::SparseMatrix<double, Eigen::ColMajor, c_int>&
        objective_matrix) {
  // If the objective matrix is already upper triangular, we can skip the
  // temporary.
  if (IsUpperTriangular(objective_matrix)) {
    return UpdateUpperTriangularObjectiveMatrix(objective_matrix,
                                                workspace_.get());
  }

  // If not upper triangular, make a temporary.
  Eigen::SparseMatrix<double, Eigen::ColMajor, c_int>
      objective_matrix_upper_triangle =
          objective_matrix.triangularView<Eigen::Upper>();
  return UpdateUpperTriangularObjectiveMatrix(objective_matrix_upper_triangle,
                                              workspace_.get());
}